

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O2

void Fxch_DivPrint(Fxch_Man_t *pFxchMan,int iDiv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  int iVar4;
  
  p = Hsh_VecReadEntry(pFxchMan->pDivHash,iDiv);
  printf("Div %7d : ",(ulong)(uint)iDiv);
  if ((-1 < iDiv) && (iDiv < pFxchMan->vDivWeights->nSize)) {
    printf("Weight %12.5f  ",(double)pFxchMan->vDivWeights->pArray[(uint)iDiv]);
    for (iVar4 = 0; iVar4 < p->nSize; iVar4 = iVar4 + 1) {
      iVar1 = Vec_IntEntry(p,iVar4);
      iVar2 = Abc_LitIsCompl(iVar1);
      if (iVar2 == 0) {
        uVar3 = Abc_Lit2Var(iVar1);
        printf("%d(1)",(ulong)uVar3);
      }
    }
    printf(" + ");
    for (iVar4 = 0; iVar4 < p->nSize; iVar4 = iVar4 + 1) {
      iVar1 = Vec_IntEntry(p,iVar4);
      iVar2 = Abc_LitIsCompl(iVar1);
      if (iVar2 != 0) {
        uVar3 = Abc_Lit2Var(iVar1);
        printf("%d(2)",(ulong)uVar3);
      }
    }
    printf(" Lits =%7d  ",(ulong)(uint)pFxchMan->nLits);
    printf("Divs =%8d  \n",(ulong)(uint)pFxchMan->pDivHash->vMap->nSize);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

void Fxch_DivPrint( Fxch_Man_t* pFxchMan,
                    int iDiv )
{
    Vec_Int_t* vDiv = Hsh_VecReadEntry( pFxchMan->pDivHash, iDiv );
    int i,
        Lit;

    printf( "Div %7d : ", iDiv );
    printf( "Weight %12.5f  ", Vec_FltEntry( pFxchMan->vDivWeights, iDiv ) );

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( !Abc_LitIsCompl( Lit ) )
            printf( "%d(1)", Abc_Lit2Var( Lit ) );

    printf( " + " );

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( Abc_LitIsCompl( Lit ) )
            printf( "%d(2)", Abc_Lit2Var( Lit ) );

    printf( " Lits =%7d  ", pFxchMan->nLits );
    printf( "Divs =%8d  \n", Hsh_VecSize( pFxchMan->pDivHash ) );
}